

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O0

void __thiscall
sisl::
array_n<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_2,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
::array_n(array_n<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_2,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          *this,uint d0,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  uint *local_128;
  uint local_108 [4];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  int local_3c;
  uint local_38;
  int i_1;
  va_list vl;
  size_type i;
  uint n;
  uint d0_local;
  array_n<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_2,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *this_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  local_f8 = in_RDX;
  local_f0 = in_RCX;
  local_e8 = in_R8;
  local_e0 = in_R9;
  std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::allocator
            ((allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this);
  vl[0].overflow_arg_area = local_108;
  vl[0]._0_8_ = &stack0x00000008;
  i_1 = 0x30;
  local_38 = 0x10;
  this->_dims[0] = d0;
  i._0_4_ = d0;
  for (local_3c = 1; local_3c < 2; local_3c = local_3c + 1) {
    if (local_38 < 0x29) {
      local_128 = (uint *)((long)vl[0].overflow_arg_area + (long)(int)local_38);
      local_38 = local_38 + 8;
    }
    else {
      local_128 = (uint *)vl[0]._0_8_;
      vl[0]._0_8_ = vl[0]._0_8_ + 8;
    }
    this->_dims[local_3c] = *local_128;
    i._0_4_ = this->_dims[local_3c] * (uint)i;
  }
  _alloc(this,(uint)i);
  return;
}

Assistant:

array_n(unsigned int d0, ...) {
            unsigned int n = d0;
            size_type i;

            // Start with d0
            va_list vl;
            va_start(vl, d0);

            _dims[0] = d0;

            for(int i = 1; i < N; i++) {
                _dims[i] = va_arg(vl, unsigned int);
                n *= _dims[i];
            }
            va_end(vl);
            _alloc(n);
#ifdef SISL_CL
            _onDevice = false;
            _deviceMemory = nullptr;
#endif
        }